

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O3

void save_load_tree(log_multi *b,io_buf *model_file,bool read,bool text)

{
  size_t *data;
  bool *data_00;
  ostream *poVar1;
  uint uVar2;
  node *pnVar3;
  node_pred *pnVar4;
  long lVar5;
  uint32_t *data_01;
  char *pcVar6;
  bool bVar7;
  ulong uVar8;
  double *data_02;
  uint32_t temp_1;
  uint32_t temp;
  node node;
  stringstream msg;
  uint local_228;
  uint local_224;
  ulong local_220;
  node local_218;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if ((model_file->files)._end != (model_file->files)._begin) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"k = ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    data = &b->max_predictors;
    if (read) {
      io_buf::bin_read_fixed(model_file,(char *)data,4,"");
    }
    else {
      bin_text_write_fixed(model_file,(char *)data,4,(stringstream *)local_1b8,text);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"nodes = ",8);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    local_224 = (int)((ulong)((long)(b->nodes)._end - (long)(b->nodes)._begin) >> 3) * -0x45d1745d;
    if (read) {
      io_buf::bin_read_fixed(model_file,(char *)&local_224,4,"");
      if (1 < local_224) {
        uVar2 = 1;
        do {
          local_218._0_8_ = local_218._0_8_ & 0xffffffff00000000;
          local_218.preds.end_array = (node_pred *)0x0;
          local_218.preds.erase_count._0_5_ = 0;
          local_218.preds._begin = (node_pred *)0x0;
          local_218.preds._end = (node_pred *)0x0;
          local_218.preds.erase_count._5_3_ = 0;
          local_218.min_count = 0;
          local_218.internal = false;
          v_array<node_pred>::clear(&local_218.preds);
          local_218.base_predictor = 0;
          local_218.max_count = 0;
          local_218._60_8_ = 0;
          local_218._68_8_ = 0;
          local_218.max_count_label = 1;
          local_218.left = 0;
          local_218.right = 0;
          v_array<node>::push_back(&b->nodes,&local_218);
          uVar2 = uVar2 + 1;
        } while (uVar2 < local_224);
      }
    }
    else {
      bin_text_write_fixed(model_file,(char *)&local_224,4,(stringstream *)local_1b8,text);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"max predictors = ",0x11);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if (read) {
      io_buf::bin_read_fixed(model_file,(char *)data,8,"");
    }
    else {
      bin_text_write_fixed(model_file,(char *)data,8,(stringstream *)local_1b8,text);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"predictors_used = ",0x12);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if (read) {
      io_buf::bin_read_fixed(model_file,(char *)&b->predictors_used,8,"");
    }
    else {
      bin_text_write_fixed(model_file,(char *)&b->predictors_used,8,(stringstream *)local_1b8,text);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"progress = ",0xb);
    bVar7 = SUB81((ostream *)local_1a8,0);
    poVar1 = std::ostream::_M_insert<bool>(bVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if (read) {
      io_buf::bin_read_fixed(model_file,&b->progress,1,"");
    }
    else {
      bin_text_write_fixed(model_file,&b->progress,1,(stringstream *)local_1b8,text);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"swap_resist = ",0xe);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    if (read) {
      io_buf::bin_read_fixed(model_file,(char *)&b->swap_resist,4,"");
    }
    else {
      bin_text_write_fixed(model_file,(char *)&b->swap_resist,4,(stringstream *)local_1b8,text);
    }
    pnVar3 = (b->nodes)._begin;
    if ((b->nodes)._end != pnVar3) {
      local_220 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," parent = ",10);
        pnVar3 = pnVar3 + local_220;
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        if (read) {
          io_buf::bin_read_fixed(model_file,(char *)pnVar3,4,"");
        }
        else {
          bin_text_write_fixed(model_file,(char *)pnVar3,4,(stringstream *)local_1b8,text);
        }
        local_228 = (int)((ulong)((long)(pnVar3->preds)._end - (long)(pnVar3->preds)._begin) >> 3) *
                    -0x55555555;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," preds = ",9);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        if (read) {
          io_buf::bin_read_fixed(model_file,(char *)&local_228,4,"");
          if (local_228 != 0) {
            uVar2 = 0;
            do {
              local_218.preds._end = (node_pred *)0x1;
              local_218._0_8_ = 0;
              local_218.preds._begin = (node_pred *)0x0;
              v_array<node_pred>::push_back(&pnVar3->preds,(node_pred *)&local_218);
              uVar2 = uVar2 + 1;
            } while (uVar2 < local_228);
          }
        }
        else {
          bin_text_write_fixed(model_file,(char *)&local_228,4,(stringstream *)local_1b8,text);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," min_count = ",0xd)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        if (read) {
          io_buf::bin_read_fixed(model_file,(char *)&pnVar3->min_count,4,"");
        }
        else {
          bin_text_write_fixed
                    (model_file,(char *)&pnVar3->min_count,4,(stringstream *)local_1b8,text);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," internal = ",0xc);
        std::ostream::_M_insert<bool>(bVar7);
        data_00 = &pnVar3->internal;
        if (read) {
          io_buf::bin_read_fixed(model_file,data_00,1,"");
        }
        else {
          bin_text_write_fixed(model_file,data_00,1,(stringstream *)local_1b8,text);
        }
        if (*data_00 == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," base_predictor = ",0x12);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          if (read) {
            io_buf::bin_read_fixed(model_file,(char *)&pnVar3->base_predictor,4,"");
          }
          else {
            bin_text_write_fixed
                      (model_file,(char *)&pnVar3->base_predictor,4,(stringstream *)local_1b8,text);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," left = ",8);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          if (read) {
            io_buf::bin_read_fixed(model_file,(char *)&pnVar3->left,4,"");
          }
          else {
            bin_text_write_fixed(model_file,(char *)&pnVar3->left,4,(stringstream *)local_1b8,text);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," right = ",9);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          if (read) {
            io_buf::bin_read_fixed(model_file,(char *)&pnVar3->right,4,"");
          }
          else {
            bin_text_write_fixed(model_file,(char *)&pnVar3->right,4,(stringstream *)local_1b8,text)
            ;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," norm_Eh = ",0xb)
          ;
          std::ostream::_M_insert<double>((double)pnVar3->norm_Eh);
          if (read) {
            io_buf::bin_read_fixed(model_file,(char *)&pnVar3->norm_Eh,4,"");
          }
          else {
            bin_text_write_fixed
                      (model_file,(char *)&pnVar3->norm_Eh,4,(stringstream *)local_1b8,text);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," Eh = ",6);
          std::ostream::_M_insert<double>(pnVar3->Eh);
          if (read) {
            io_buf::bin_read_fixed(model_file,(char *)&pnVar3->Eh,8,"");
          }
          else {
            bin_text_write_fixed(model_file,(char *)&pnVar3->Eh,8,(stringstream *)local_1b8,text);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," n = ",5);
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
          data_01 = &pnVar3->n;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," max_count = ",0xd);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          if (read) {
            io_buf::bin_read_fixed(model_file,(char *)&pnVar3->max_count,4,"");
          }
          else {
            bin_text_write_fixed
                      (model_file,(char *)&pnVar3->max_count,4,(stringstream *)local_1b8,text);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," max_count_label = ",0x13);
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
          data_01 = &pnVar3->max_count_label;
        }
        if (read) {
          io_buf::bin_read_fixed(model_file,(char *)data_01,4,"");
        }
        else {
          bin_text_write_fixed(model_file,(char *)data_01,4,(stringstream *)local_1b8,text);
        }
        pnVar4 = (pnVar3->preds)._begin;
        if ((pnVar3->preds)._end != pnVar4) {
          lVar5 = 0xc;
          uVar8 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Ehk = ",8);
            data_02 = (double *)((long)pnVar4 + lVar5 + -0xc);
            std::ostream::_M_insert<double>(*data_02);
            if (read) {
              io_buf::bin_read_fixed(model_file,(char *)data_02,8,"");
            }
            else {
              bin_text_write_fixed(model_file,(char *)data_02,8,(stringstream *)local_1b8,text);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," norm_Ehk = ",0xc);
            std::ostream::_M_insert<double>((double)*(float *)((long)pnVar4 + lVar5 + -4));
            pcVar6 = (char *)((long)pnVar4 + lVar5 + -4);
            if (read) {
              io_buf::bin_read_fixed(model_file,pcVar6,4,"");
            }
            else {
              bin_text_write_fixed(model_file,pcVar6,4,(stringstream *)local_1b8,text);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," nk = ",6);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            pcVar6 = (char *)((long)&pnVar4->Ehk + lVar5);
            if (read) {
              io_buf::bin_read_fixed(model_file,pcVar6,4,"");
            }
            else {
              bin_text_write_fixed(model_file,pcVar6,4,(stringstream *)local_1b8,text);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," label = ",9);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            pcVar6 = (char *)((long)&pnVar4->Ehk + lVar5 + 4);
            if (read) {
              io_buf::bin_read_fixed(model_file,pcVar6,4,"");
            }
            else {
              bin_text_write_fixed(model_file,pcVar6,4,(stringstream *)local_1b8,text);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," label_count = ",0xf);
            poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
            pcVar6 = (char *)((long)&pnVar4->norm_Ehk + lVar5);
            if (read) {
              io_buf::bin_read_fixed(model_file,pcVar6,4,"");
            }
            else {
              bin_text_write_fixed(model_file,pcVar6,4,(stringstream *)local_1b8,text);
            }
            uVar8 = uVar8 + 1;
            pnVar4 = (pnVar3->preds)._begin;
            lVar5 = lVar5 + 0x18;
          } while (uVar8 < (ulong)(((long)(pnVar3->preds)._end - (long)pnVar4 >> 3) *
                                  -0x5555555555555555));
        }
        local_220 = local_220 + 1;
        pnVar3 = (b->nodes)._begin;
      } while (local_220 < (ulong)(((long)(b->nodes)._end - (long)pnVar3 >> 3) * 0x2e8ba2e8ba2e8ba3)
              );
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

void save_load_tree(log_multi& b, io_buf& model_file, bool read, bool text)
{
  if (model_file.files.size() > 0)
  {
    stringstream msg;
    msg << "k = " << b.k;
    bin_text_read_write_fixed(model_file, (char*)&b.max_predictors, sizeof(b.k), "", read, msg, text);

    msg << "nodes = " << b.nodes.size() << " ";
    uint32_t temp = (uint32_t)b.nodes.size();
    bin_text_read_write_fixed(model_file, (char*)&temp, sizeof(temp), "", read, msg, text);
    if (read)
      for (uint32_t j = 1; j < temp; j++) b.nodes.push_back(init_node());

    msg << "max predictors = " << b.max_predictors << " ";
    bin_text_read_write_fixed(model_file, (char*)&b.max_predictors, sizeof(b.max_predictors), "", read, msg, text);

    msg << "predictors_used = " << b.predictors_used << " ";
    bin_text_read_write_fixed(model_file, (char*)&b.predictors_used, sizeof(b.predictors_used), "", read, msg, text);

    msg << "progress = " << b.progress << " ";
    bin_text_read_write_fixed(model_file, (char*)&b.progress, sizeof(b.progress), "", read, msg, text);

    msg << "swap_resist = " << b.swap_resist << "\n";
    bin_text_read_write_fixed(model_file, (char*)&b.swap_resist, sizeof(b.swap_resist), "", read, msg, text);

    for (size_t j = 0; j < b.nodes.size(); j++)
    {
      // Need to read or write nodes.
      node& n = b.nodes[j];

      msg << " parent = " << n.parent;
      bin_text_read_write_fixed(model_file, (char*)&n.parent, sizeof(n.parent), "", read, msg, text);

      uint32_t temp = (uint32_t)n.preds.size();

      msg << " preds = " << temp;
      bin_text_read_write_fixed(model_file, (char*)&temp, sizeof(temp), "", read, msg, text);
      if (read)
        for (uint32_t k = 0; k < temp; k++) n.preds.push_back(node_pred(1));

      msg << " min_count = " << n.min_count;
      bin_text_read_write_fixed(model_file, (char*)&n.min_count, sizeof(n.min_count), "", read, msg, text);

      msg << " internal = " << n.internal;
      bin_text_read_write_fixed(model_file, (char*)&n.internal, sizeof(n.internal), "", read, msg, text);

      if (n.internal)
      {
        msg << " base_predictor = " << n.base_predictor;
        bin_text_read_write_fixed(model_file, (char*)&n.base_predictor, sizeof(n.base_predictor), "", read, msg, text);

        msg << " left = " << n.left;
        bin_text_read_write_fixed(model_file, (char*)&n.left, sizeof(n.left), "", read, msg, text);

        msg << " right = " << n.right;
        bin_text_read_write_fixed(model_file, (char*)&n.right, sizeof(n.right), "", read, msg, text);

        msg << " norm_Eh = " << n.norm_Eh;
        bin_text_read_write_fixed(model_file, (char*)&n.norm_Eh, sizeof(n.norm_Eh), "", read, msg, text);

        msg << " Eh = " << n.Eh;
        bin_text_read_write_fixed(model_file, (char*)&n.Eh, sizeof(n.Eh), "", read, msg, text);

        msg << " n = " << n.n << "\n";
        bin_text_read_write_fixed(model_file, (char*)&n.n, sizeof(n.n), "", read, msg, text);
      }
      else
      {
        msg << " max_count = " << n.max_count;
        bin_text_read_write_fixed(model_file, (char*)&n.max_count, sizeof(n.max_count), "", read, msg, text);
        msg << " max_count_label = " << n.max_count_label << "\n";
        bin_text_read_write_fixed(
            model_file, (char*)&n.max_count_label, sizeof(n.max_count_label), "", read, msg, text);
      }

      for (size_t k = 0; k < n.preds.size(); k++)
      {
        node_pred& p = n.preds[k];

        msg << "  Ehk = " << p.Ehk;
        bin_text_read_write_fixed(model_file, (char*)&p.Ehk, sizeof(p.Ehk), "", read, msg, text);

        msg << " norm_Ehk = " << p.norm_Ehk;
        bin_text_read_write_fixed(model_file, (char*)&p.norm_Ehk, sizeof(p.norm_Ehk), "", read, msg, text);

        msg << " nk = " << p.nk;
        bin_text_read_write_fixed(model_file, (char*)&p.nk, sizeof(p.nk), "", read, msg, text);

        msg << " label = " << p.label;
        bin_text_read_write_fixed(model_file, (char*)&p.label, sizeof(p.label), "", read, msg, text);

        msg << " label_count = " << p.label_count << "\n";
        bin_text_read_write_fixed(model_file, (char*)&p.label_count, sizeof(p.label_count), "", read, msg, text);
      }
    }
  }
}